

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

CallbackInfo * __thiscall
Js::DynamicProfileInfo::EnsureCallbackInfo
          (DynamicProfileInfo *this,FunctionBody *funcBody,ProfileId callSiteId)

{
  CallbackInfoList *list;
  ScriptContext *pSVar1;
  Recycler *alloc;
  Type *pTVar2;
  Recycler *pRVar3;
  undefined1 local_70 [8];
  TrackAllocData data;
  EditingIterator iter;
  
  list = (CallbackInfoList *)
         FunctionProxy::GetAuxPtr((FunctionProxy *)funcBody,CallbackArgOutInfoList);
  if (list == (CallbackInfoList *)0x0) {
    pSVar1 = FunctionProxy::GetScriptContext((FunctionProxy *)funcBody);
    pRVar3 = pSVar1->recycler;
    local_70 = (undefined1  [8])&SList<Js::CallbackInfo*,Memory::Recycler,RealCount>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_499211e;
    data.filename._0_4_ = 0x20c;
    alloc = Memory::Recycler::TrackAllocInfo(pRVar3,(TrackAllocData *)local_70);
    list = (CallbackInfoList *)new<Memory::Recycler>(0x18,alloc,0x387914);
    (list->super_SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>).
    super_SListNodeBase<Memory::Recycler> = 0;
    ((RealCount *)
    ((long)&list->super_SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> + 8))->count = 0;
    Memory::Recycler::WBSetBit((char *)list);
    *(CallbackInfoList **)&list->super_SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> =
         list;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(list);
    ((RealCount *)
    ((long)&list->super_SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> + 8))->count = 0;
    list->allocator = pRVar3;
    FunctionProxy::SetAuxPtr((FunctionProxy *)funcBody,CallbackArgOutInfoList,list);
  }
  TryFindCallbackInfoIterator((EditingIterator *)&data.line,list,callSiteId);
  if ((iter.super_EditingIterator.super_Iterator.list ==
       (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)0x0) ||
     (iter.super_EditingIterator.super_Iterator.list ==
      (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)data._32_8_)) {
    pSVar1 = FunctionProxy::GetScriptContext((FunctionProxy *)funcBody);
    local_70 = (undefined1  [8])&CallbackInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_499211e;
    data.filename._0_4_ = 0x217;
    pRVar3 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_70);
    local_70 = (undefined1  [8])new<Memory::Recycler>(0xc,pRVar3,0x56b216);
    ((CallbackInfo *)local_70)->callSiteId = callSiteId;
    ((CallbackInfo *)local_70)->sourceId = 0xffffffff;
    *(byte *)local_70 = *(byte *)local_70 | 1;
    SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::InsertBefore
              ((EditingIterator *)&data.line,*(Recycler **)(data._32_8_ + 0x10),
               (CallbackInfo **)local_70);
  }
  else {
    pTVar2 = SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                       ((Iterator *)&data.line);
    local_70 = (undefined1  [8])pTVar2->ptr;
  }
  return (CallbackInfo *)local_70;
}

Assistant:

CallbackInfo * DynamicProfileInfo::EnsureCallbackInfo(FunctionBody * funcBody, ProfileId callSiteId)
    {
        CallbackInfoList * list = funcBody->GetCallbackInfoList();
        if (list == nullptr)
        {
            Recycler * recycler = funcBody->GetScriptContext()->GetRecycler();
            list = RecyclerNew(recycler, CallbackInfoList, recycler);
            funcBody->SetCallbackInfoList(list);
        }

        CallbackInfoList::EditingIterator iter = TryFindCallbackInfoIterator(list, callSiteId);
        if (iter.IsValid())
        {
            return iter.Data();
        }

        // Callsite is not already in the list, so add it to the end.
        CallbackInfo * info = info = RecyclerNewStructZ(funcBody->GetScriptContext()->GetRecycler(), CallbackInfo);
        info->callSiteId = callSiteId;
        info->sourceId = NoSourceId;
        info->canInlineCallback = true;

        iter.InsertBefore(info);
        return info;
    }